

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::UpdateFunctionPointer(ExecutorX86 *this,uint source,uint target)

{
  uchar *puVar1;
  uint uVar2;
  uchar **ppuVar3;
  ExpiredFunctionAddressList *pEVar4;
  ExpiredFunctionAddressList *info;
  uint i;
  uint target_local;
  uint source_local;
  ExecutorX86 *this_local;
  
  ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->functionAddress,target);
  puVar1 = *ppuVar3;
  ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->functionAddress,source);
  *ppuVar3 = puVar1;
  info._4_4_ = 0;
  while( true ) {
    uVar2 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::size
                      (&this->expiredFunctionAddressLists);
    if (uVar2 <= info._4_4_) break;
    pEVar4 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                       (&this->expiredFunctionAddressLists,info._4_4_);
    if (source < pEVar4->count) {
      ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->functionAddress,target)
      ;
      pEVar4->data[source] = *ppuVar3;
    }
    info._4_4_ = info._4_4_ + 1;
  }
  return;
}

Assistant:

void ExecutorX86::UpdateFunctionPointer(unsigned source, unsigned target)
{
	functionAddress[source] = functionAddress[target];

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		if(source < info.count)
			info.data[source] = functionAddress[target];
	}
}